

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinition.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::ProgramInterfaceDefinition::isTypeIntegerOrContainsIntegers
          (ProgramInterfaceDefinition *this,VarType *varType)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ProgramInterfaceDefinition *this_00;
  ulong uVar5;
  ulong uVar6;
  
  for (; iVar3 = *(int *)this, iVar3 == 1; this = *(ProgramInterfaceDefinition **)(this + 8)) {
  }
  if (iVar3 == 0) {
    bVar2 = true;
    if (3 < *(int *)(this + 8) - 0x1bU) {
      bVar2 = *(int *)(this + 8) - 0x1fU < 4;
    }
  }
  else {
    if (iVar3 == 2) {
      lVar1 = *(long *)(*(long *)(this + 8) + 0x20);
      uVar4 = (*(long *)(*(long *)(this + 8) + 0x28) - lVar1) / 0x38;
      iVar3 = (int)uVar4;
      uVar6 = 0;
      uVar5 = 0;
      if (0 < iVar3) {
        uVar5 = uVar4 & 0xffffffff;
      }
      this_00 = (ProgramInterfaceDefinition *)(lVar1 + 0x20);
      do {
        if (uVar5 == uVar6) {
          return (long)uVar6 < (long)iVar3;
        }
        bVar2 = isTypeIntegerOrContainsIntegers(this_00,varType);
        uVar6 = uVar6 + 1;
        this_00 = this_00 + 0x38;
      } while (!bVar2);
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

static bool isTypeIntegerOrContainsIntegers (const glu::VarType& varType)
{
	if (varType.isBasicType())
		return glu::isDataTypeIntOrIVec(varType.getBasicType()) || glu::isDataTypeUintOrUVec(varType.getBasicType());
	else if (varType.isArrayType())
		return isTypeIntegerOrContainsIntegers(varType.getElementType());
	else if (varType.isStructType())
	{
		for (int ndx = 0; ndx < varType.getStructPtr()->getNumMembers(); ++ndx)
			if (isTypeIntegerOrContainsIntegers(varType.getStructPtr()->getMember(ndx).getType()))
				return true;
		return false;
	}
	else
	{
		DE_ASSERT(false);
		return true;
	}
}